

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# N.cpp
# Opt level: O0

nodeit * __thiscall N::operator[](N *this,N *p)

{
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *this_00;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *p_Var1;
  reference ppNVar2;
  reference pvVar3;
  size_type __n;
  size_type sVar4;
  iterator start;
  iterator end;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> start_00;
  __normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> end_00;
  value_type in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  N *in_RDI;
  bool bVar5;
  int i;
  int offset;
  vector<N_*,_std::allocator<N_*>_> *in_stack_ffffffffffffff78;
  N *pNVar6;
  int local_18;
  int local_14;
  
  if (in_RDX == (value_type)0x0) {
    all(in_RDI);
    pNVar6 = in_RDI;
  }
  else {
    local_14 = 0;
    local_18 = 0;
    pNVar6 = in_RDI;
    while( true ) {
      this_00 = (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)(long)local_18;
      p_Var1 = (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_> *)
               std::vector<N_*,_std::allocator<N_*>_>::size
                         ((vector<N_*,_std::allocator<N_*>_> *)
                          &in_RSI[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      bVar5 = false;
      if (this_00 < p_Var1) {
        ppNVar2 = std::vector<N_*,_std::allocator<N_*>_>::operator[]
                            ((vector<N_*,_std::allocator<N_*>_> *)
                             &in_RSI[1].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish,(long)local_18);
        bVar5 = *ppNVar2 != in_RDX;
      }
      if (!bVar5) break;
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RSI,(long)local_18);
      local_14 = *pvVar3 + local_14;
      local_18 = local_18 + 1;
    }
    __n = (size_type)local_14;
    sVar4 = std::vector<N_*,_std::allocator<N_*>_>::size
                      ((vector<N_*,_std::allocator<N_*>_> *)
                       &in_RSI[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
    if (__n == sVar4) {
      start = std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_ffffffffffffff78);
      end = std::vector<N_*,_std::allocator<N_*>_>::end(in_stack_ffffffffffffff78);
      CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::CIt
                ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  *)in_RDI,
                 (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>)start._M_current,
                 (__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>)end._M_current);
    }
    else {
      std::vector<N_*,_std::allocator<N_*>_>::begin(in_stack_ffffffffffffff78);
      start_00 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::
                 operator+(this_00,__n);
      std::vector<N_*,_std::allocator<N_*>_>::begin(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::operator+
                (this_00,__n);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RSI,(long)local_18);
      end_00 = __gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>::
               operator+(this_00,__n);
      CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>::CIt
                ((CIt<__gnu_cxx::__normal_iterator<N_**,_std::vector<N_*,_std::allocator<N_*>_>_>,_N>
                  *)in_RDI,start_00,end_00);
    }
  }
  return (nodeit *)pNVar6;
}

Assistant:

nodeit N::operator[](const N* p) {
    if (p == nullptr) return (*this).all();

    int offset = 0, i = 0;
    while (i < ps.size() and ps[i] != p) offset += osi[i++];

    if (offset == os.size()) return nodeit(os.end(), os.end());
    return nodeit(os.begin() + offset, os.begin() + offset + osi[i]);
}